

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByLowercaseName(Descriptor *this,ConstStringParam key)

{
  FileDescriptorTables *this_00;
  FieldDescriptor *pFVar1;
  FieldDescriptor *pFVar2;
  StringPiece local_28;
  
  this_00 = *(FileDescriptorTables **)(*(long *)(this + 0x10) + 0x80);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_28,key);
  pFVar1 = FileDescriptorTables::FindFieldByLowercaseName(this_00,this,local_28);
  if (pFVar1 == (FieldDescriptor *)0x0) {
    pFVar2 = (FieldDescriptor *)0x0;
  }
  else {
    pFVar2 = (FieldDescriptor *)0x0;
    if (((byte)pFVar1[1] & 8) == 0) {
      pFVar2 = pFVar1;
    }
  }
  return pFVar2;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByLowercaseName(
    ConstStringParam key) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByLowercaseName(this, key);
  if (result == nullptr || result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}